

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum-dtoa.cpp
# Opt level: O0

void icu_63::double_conversion::GenerateShortestDigits
               (Bignum *numerator,Bignum *denominator,Bignum *delta_minus,Bignum *delta_plus,
               bool is_even,Vector<char> buffer,int *length)

{
  bool bVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  char *pcVar5;
  int compare;
  bool in_delta_room_plus;
  bool in_delta_room_minus;
  uint16_t digit;
  int *length_local;
  Bignum *pBStack_28;
  bool is_even_local;
  Bignum *delta_plus_local;
  Bignum *delta_minus_local;
  Bignum *denominator_local;
  Bignum *numerator_local;
  
  bVar1 = Bignum::Equal(delta_minus,delta_plus);
  pBStack_28 = delta_minus;
  if (!bVar1) {
    pBStack_28 = delta_plus;
  }
  *length = 0;
  while( true ) {
    uVar3 = Bignum::DivideModuloIntBignum(numerator,denominator);
    iVar4 = *length;
    *length = iVar4 + 1;
    pcVar5 = Vector<char>::operator[](&buffer,iVar4);
    *pcVar5 = (char)uVar3 + '0';
    if (is_even) {
      bVar2 = Bignum::LessEqual(numerator,delta_minus);
      iVar4 = Bignum::PlusCompare(numerator,pBStack_28,denominator);
      bVar1 = -1 < iVar4;
    }
    else {
      bVar2 = Bignum::Less(numerator,delta_minus);
      iVar4 = Bignum::PlusCompare(numerator,pBStack_28,denominator);
      bVar1 = 0 < iVar4;
    }
    if ((bVar2 != false) || (bVar1)) break;
    Bignum::Times10(numerator);
    Bignum::Times10(delta_minus);
    if (delta_minus != pBStack_28) {
      Bignum::Times10(pBStack_28);
    }
  }
  if ((bVar2 == false) || (!bVar1)) {
    if (bVar2 == false) {
      pcVar5 = Vector<char>::operator[](&buffer,*length + -1);
      *pcVar5 = *pcVar5 + '\x01';
    }
  }
  else {
    iVar4 = Bignum::PlusCompare(numerator,numerator,denominator);
    if (-1 < iVar4) {
      if (iVar4 < 1) {
        pcVar5 = Vector<char>::operator[](&buffer,*length + -1);
        if ((*pcVar5 + -0x30) % 2 != 0) {
          pcVar5 = Vector<char>::operator[](&buffer,*length + -1);
          *pcVar5 = *pcVar5 + '\x01';
        }
      }
      else {
        pcVar5 = Vector<char>::operator[](&buffer,*length + -1);
        *pcVar5 = *pcVar5 + '\x01';
      }
    }
  }
  return;
}

Assistant:

static void GenerateShortestDigits(Bignum* numerator, Bignum* denominator,
                                   Bignum* delta_minus, Bignum* delta_plus,
                                   bool is_even,
                                   Vector<char> buffer, int* length) {
  // Small optimization: if delta_minus and delta_plus are the same just reuse
  // one of the two bignums.
  if (Bignum::Equal(*delta_minus, *delta_plus)) {
    delta_plus = delta_minus;
  }
  *length = 0;
  for (;;) {
    uint16_t digit;
    digit = numerator->DivideModuloIntBignum(*denominator);
    ASSERT(digit <= 9);  // digit is a uint16_t and therefore always positive.
    // digit = numerator / denominator (integer division).
    // numerator = numerator % denominator.
    buffer[(*length)++] = static_cast<char>(digit + '0');

    // Can we stop already?
    // If the remainder of the division is less than the distance to the lower
    // boundary we can stop. In this case we simply round down (discarding the
    // remainder).
    // Similarly we test if we can round up (using the upper boundary).
    bool in_delta_room_minus;
    bool in_delta_room_plus;
    if (is_even) {
      in_delta_room_minus = Bignum::LessEqual(*numerator, *delta_minus);
    } else {
      in_delta_room_minus = Bignum::Less(*numerator, *delta_minus);
    }
    if (is_even) {
      in_delta_room_plus =
          Bignum::PlusCompare(*numerator, *delta_plus, *denominator) >= 0;
    } else {
      in_delta_room_plus =
          Bignum::PlusCompare(*numerator, *delta_plus, *denominator) > 0;
    }
    if (!in_delta_room_minus && !in_delta_room_plus) {
      // Prepare for next iteration.
      numerator->Times10();
      delta_minus->Times10();
      // We optimized delta_plus to be equal to delta_minus (if they share the
      // same value). So don't multiply delta_plus if they point to the same
      // object.
      if (delta_minus != delta_plus) {
        delta_plus->Times10();
      }
    } else if (in_delta_room_minus && in_delta_room_plus) {
      // Let's see if 2*numerator < denominator.
      // If yes, then the next digit would be < 5 and we can round down.
      int compare = Bignum::PlusCompare(*numerator, *numerator, *denominator);
      if (compare < 0) {
        // Remaining digits are less than .5. -> Round down (== do nothing).
      } else if (compare > 0) {
        // Remaining digits are more than .5 of denominator. -> Round up.
        // Note that the last digit could not be a '9' as otherwise the whole
        // loop would have stopped earlier.
        // We still have an assert here in case the preconditions were not
        // satisfied.
        ASSERT(buffer[(*length) - 1] != '9');
        buffer[(*length) - 1]++;
      } else {
        // Halfway case.
        // TODO(floitsch): need a way to solve half-way cases.
        //   For now let's round towards even (since this is what Gay seems to
        //   do).

        if ((buffer[(*length) - 1] - '0') % 2 == 0) {
          // Round down => Do nothing.
        } else {
          ASSERT(buffer[(*length) - 1] != '9');
          buffer[(*length) - 1]++;
        }
      }
      return;
    } else if (in_delta_room_minus) {
      // Round down (== do nothing).
      return;
    } else {  // in_delta_room_plus
      // Round up.
      // Note again that the last digit could not be '9' since this would have
      // stopped the loop earlier.
      // We still have an ASSERT here, in case the preconditions were not
      // satisfied.
      ASSERT(buffer[(*length) -1] != '9');
      buffer[(*length) - 1]++;
      return;
    }
  }
}